

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O1

void __thiscall kj::parse::anon_unknown_0::TestCase316::run(TestCase316 *this)

{
  char *pcVar1;
  uint *puVar2;
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> result_2;
  Input input;
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>_>
  parser;
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> result;
  AddFailureAdapter local_78;
  IteratorInput<char,_const_char_*> local_60;
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>_>
  local_40;
  char local_34;
  uint local_30;
  char local_2c;
  uint local_28;
  uint local_24;
  
  local_40.rest.rest._2_1_ = 0;
  local_40.rest.rest.first =
       (Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>
        )0x72;
  local_40.first =
       (Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>
        )0x62;
  local_40.rest.first.subParser =
       (Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>
        )0x61;
  local_60.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_60.pos = "bar";
  local_60.end = "";
  local_60.best = "bar";
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:320:31)>_>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&local_40,&local_60);
  puVar2 = (uint *)0x0;
  if (local_34 != '\0') {
    puVar2 = &local_30;
  }
  if (local_34 == '\x01') {
    if ((*puVar2 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
      local_78.handled = true;
      local_78._1_3_ = 0;
      kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x147,ERROR,
                 "\"failed: expected \" \"(123u) == (get<0>(*value))\", 123u, get<0>(*value)",
                 (char (*) [44])"failed: expected (123u) == (get<0>(*value))",(uint *)&local_78,
                 puVar2);
    }
    puVar2 = (uint *)0x0;
    if (local_2c != '\0') {
      puVar2 = &local_28;
    }
    if (local_2c == '\x01') {
      if ((*puVar2 != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
        local_78.handled = true;
        local_78._1_3_ = 1;
        kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x149,ERROR,"\"failed: expected \" \"(456u) == (*value2)\", 456u, *value2",
                   (char (*) [37])"failed: expected (456u) == (*value2)",(uint *)&local_78,puVar2);
      }
    }
    else {
      local_78.file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
      ;
      local_78.line = 0x14b;
      local_78.handled = true;
      kj::_::Debug::log<char_const(&)[19],char_const(&)[24]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x14b,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
                 (char (*) [24])"Expected 456, got null.");
      AddFailureAdapter::~AddFailureAdapter(&local_78);
    }
    if ((local_24 != 0x315) && (kj::_::Debug::minSeverity < 3)) {
      local_78.handled = true;
      local_78._1_3_ = 3;
      kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x14d,ERROR,
                 "\"failed: expected \" \"(789u) == (get<2>(*value))\", 789u, get<2>(*value)",
                 (char (*) [44])"failed: expected (789u) == (get<2>(*value))",(uint *)&local_78,
                 &local_24);
    }
  }
  else {
    local_78.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_78.line = 0x14f;
    local_78.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x14f,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [33])"Expected result tuple, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_78);
  }
  pcVar1 = local_60.pos;
  if ((local_60.pos != local_60.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x151,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if (local_60.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_60.best < pcVar1) {
      local_60.best = pcVar1;
    }
    if (local_60.best <= (local_60.parent)->best) {
      local_60.best = (local_60.parent)->best;
    }
    (local_60.parent)->best = local_60.best;
  }
  local_60.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_60.pos = "br";
  local_60.end = "";
  local_60.best = "br";
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:320:31)>_>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&local_40,&local_60);
  puVar2 = &local_30;
  if (local_34 == '\0') {
    puVar2 = (uint *)0x0;
  }
  if (local_34 == '\x01') {
    if ((*puVar2 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
      local_78.handled = true;
      local_78._1_3_ = 0;
      kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(123u) == (get<0>(*value))\", 123u, get<0>(*value)",
                 (char (*) [44])"failed: expected (123u) == (get<0>(*value))",(uint *)&local_78,
                 puVar2);
    }
    if ((local_2c == '\x01') && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x15a,ERROR,"\"failed: expected \" \"get<1>(*value) == nullptr\"",
                 (char (*) [43])"failed: expected get<1>(*value) == nullptr");
    }
    if ((local_24 != 0x315) && (kj::_::Debug::minSeverity < 3)) {
      local_78.handled = true;
      local_78._1_3_ = 3;
      kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x15b,ERROR,
                 "\"failed: expected \" \"(789u) == (get<2>(*value))\", 789u, get<2>(*value)",
                 (char (*) [44])"failed: expected (789u) == (get<2>(*value))",(uint *)&local_78,
                 &local_24);
    }
  }
  else {
    local_78.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_78.line = 0x15d;
    local_78.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x15d,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [33])"Expected result tuple, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_78);
  }
  pcVar1 = local_60.pos;
  if ((local_60.pos != local_60.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x15f,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if (local_60.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_60.best < pcVar1) {
      local_60.best = pcVar1;
    }
    if (local_60.best <= (local_60.parent)->best) {
      local_60.best = (local_60.parent)->best;
    }
    (local_60.parent)->best = local_60.best;
  }
  local_60.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_60.pos = "bzr";
  local_60.end = "";
  local_60.best = "bzr";
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:320:31)>_>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&local_40,&local_60);
  if ((local_78.handled == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x166,ERROR,"\"failed: expected \" \"result == nullptr\"",
               (char (*) [35])"failed: expected result == nullptr");
  }
  if (local_60.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_60.best < local_60.pos) {
      local_60.best = local_60.pos;
    }
    if (local_60.best <= (local_60.parent)->best) {
      local_60.best = (local_60.parent)->best;
    }
    (local_60.parent)->best = local_60.best;
  }
  return;
}

Assistant:

TEST(CommonParsers, OptionalParser) {
  auto parser = sequence(
      transform(exactly('b'), []() -> uint { return 123; }),
      optional(transform(exactly('a'), []() -> uint { return 456; })),
      transform(exactly('r'), []() -> uint { return 789; }));

  {
    StringPtr text = "bar";
    Input input(text.begin(), text.end());
    Maybe<Tuple<uint, Maybe<uint>, uint>> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ(123u, get<0>(*value));
      KJ_IF_MAYBE(value2, get<1>(*value)) {
        EXPECT_EQ(456u, *value2);
      } else {
        ADD_FAILURE() << "Expected 456, got null.";
      }
      EXPECT_EQ(789u, get<2>(*value));
    } else {
      ADD_FAILURE() << "Expected result tuple, got null.";
    }